

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>::
operator()(deleter<pstore::json::details::matcher<pstore::json::null_output>_> *this,
          matcher<pstore::json::null_output> *p)

{
  _func_int **pp_Var1;
  
  if (this->delete_ == true) {
    if (p == (matcher<pstore::json::null_output> *)0x0) {
      return;
    }
    pp_Var1 = p->_vptr_matcher + 1;
  }
  else {
    if (p == (matcher<pstore::json::null_output> *)0x0) {
      return;
    }
    pp_Var1 = p->_vptr_matcher;
  }
  (**pp_Var1)(p);
  return;
}

Assistant:

void operator() (T * const p) const noexcept {
                    if (delete_) {
                        delete p;
                    } else {
                        // this instance of T is in unowned memory: call the destructor but don't
                        // try to free the storage.
                        if (p) {
                            p->~T ();
                        }
                    }
                }